

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O2

int UnityCheckArraysForNull(void *expected,void *actual,_U_UINT lineNumber,char *msg)

{
  char *string;
  
  if (expected == (void *)0x0 && actual == (void *)0x0) {
    return 1;
  }
  if (expected == (void *)0x0) {
    UnityTestResultsFailBegin(lineNumber);
    string = " Expected pointer to be NULL";
  }
  else {
    if (actual != (void *)0x0) {
      return 0;
    }
    UnityTestResultsFailBegin(lineNumber);
    string = " Actual pointer was NULL";
  }
  UnityPrint(string);
  UnityAddMsgIfSpecified(msg);
  Unity.CurrentTestFailed = 1;
  longjmp((__jmp_buf_tag *)Unity.AbortFrame,1);
}

Assistant:

static int UnityCheckArraysForNull(UNITY_INTERNAL_PTR expected, UNITY_INTERNAL_PTR actual, const UNITY_LINE_TYPE lineNumber, const char* msg)
{
    /* return true if they are both NULL */
    if ((expected == NULL) && (actual == NULL))
        return 1;

    /* throw error if just expected is NULL */
    if (expected == NULL)
    {
        UnityTestResultsFailBegin(lineNumber);
        UnityPrint(UnityStrNullPointerForExpected);
        UnityAddMsgIfSpecified(msg);
        UNITY_FAIL_AND_BAIL;
    }

    /* throw error if just actual is NULL */
    if (actual == NULL)
    {
        UnityTestResultsFailBegin(lineNumber);
        UnityPrint(UnityStrNullPointerForActual);
        UnityAddMsgIfSpecified(msg);
        UNITY_FAIL_AND_BAIL;
    }

    /* return false if neither is NULL */
    return 0;
}